

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O3

from_chars_result
duckdb_fast_float::detail::parse_infnan<double>(char *first,char *last,double *value)

{
  char cVar1;
  size_t i_2;
  undefined8 uVar2;
  char running_diff;
  byte bVar4;
  char *pcVar5;
  byte *pbVar6;
  size_t i;
  long lVar7;
  char running_diff_1;
  from_chars_result fVar8;
  undefined8 uVar3;
  
  cVar1 = *first;
  pcVar5 = first + (cVar1 == '-');
  uVar3 = 0x16;
  if ((long)last - (long)pcVar5 < 3) goto LAB_00295a44;
  lVar7 = 0;
  bVar4 = 0;
  do {
    bVar4 = bVar4 | "-nan"[lVar7 + 1] ^ pcVar5[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if ((bVar4 & 0xdf) == 0) {
    first = pcVar5 + 3;
    *value = *(double *)(&DAT_013261e0 + (ulong)(cVar1 == '-') * 8);
    uVar2 = 0;
    uVar3 = uVar2;
    if ((first != last) &&
       (pbVar6 = (byte *)(pcVar5 + 4), pbVar6 != (byte *)last && pcVar5[3] == '(')) {
      do {
        bVar4 = *pbVar6;
        if (bVar4 == 0x29) {
          first = (char *)(pbVar6 + 1);
          goto LAB_00295a3f;
        }
      } while ((((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a) ||
               (uVar3 = uVar2, bVar4 == 0x5f || 0xf5 < (byte)(bVar4 - 0x3a))) &&
              (pbVar6 = pbVar6 + 1, uVar3 = 0, pbVar6 != (byte *)last));
    }
    goto LAB_00295a44;
  }
  lVar7 = 0;
  bVar4 = 0;
  do {
    bVar4 = bVar4 | "-inf"[lVar7 + 1] ^ pcVar5[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if ((bVar4 & 0xdf) != 0) goto LAB_00295a44;
  if ((long)last - (long)pcVar5 < 8) {
LAB_002959a2:
    lVar7 = 3;
  }
  else {
    lVar7 = 0;
    bVar4 = 0;
    do {
      bVar4 = bVar4 | "Bar width must not be NaN or infinity"[lVar7 + 0x20] ^ pcVar5[lVar7 + 3];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 5);
    if ((bVar4 & 0xdf) != 0) goto LAB_002959a2;
    lVar7 = 8;
  }
  first = pcVar5 + lVar7;
  *value = *(double *)(&DAT_013261d0 + (ulong)(cVar1 == '-') * 8);
LAB_00295a3f:
  uVar3 = 0;
LAB_00295a44:
  fVar8._8_8_ = uVar3;
  fVar8.ptr = first;
  return fVar8;
}

Assistant:

from_chars_result parse_infnan(const char *first, const char *last, T &value)  noexcept  {
  from_chars_result answer;
  answer.ptr = first;
  answer.ec = std::errc(); // be optimistic
  bool minusSign = false;
  if (*first == '-') { // assume first < last, so dereference without checks; C++17 20.19.3.(7.1) explicitly forbids '+' here
      minusSign = true;
      ++first;
  }
  if (last - first >= 3) {
    if (fastfloat_strncasecmp(first, "nan", 3)) {
      answer.ptr = (first += 3);
      value = minusSign ? -std::numeric_limits<T>::quiet_NaN() : std::numeric_limits<T>::quiet_NaN();
      // Check for possible nan(n-char-seq-opt), C++17 20.19.3.7, C11 7.20.1.3.3. At least MSVC produces nan(ind) and nan(snan).
      if(first != last && *first == '(') {
        for(const char* ptr = first + 1; ptr != last; ++ptr) {
          if (*ptr == ')') {
            answer.ptr = ptr + 1; // valid nan(n-char-seq-opt)
            break;
          }
          else if(!(('a' <= *ptr && *ptr <= 'z') || ('A' <= *ptr && *ptr <= 'Z') || ('0' <= *ptr && *ptr <= '9') || *ptr == '_'))
            break; // forbidden char, not nan(n-char-seq-opt)
        }
      }
      return answer;
    }
    if (fastfloat_strncasecmp(first, "inf", 3)) {
      if ((last - first >= 8) && fastfloat_strncasecmp(first + 3, "inity", 5)) {
        answer.ptr = first + 8;
      } else {
        answer.ptr = first + 3;
      }
      value = minusSign ? -std::numeric_limits<T>::infinity() : std::numeric_limits<T>::infinity();
      return answer;
    }
  }
  answer.ec = std::errc::invalid_argument;
  return answer;
}